

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O1

StackSym * StackSym::NewArgSlotSym(ArgSlot argSlotNum,Func *func,IRType type)

{
  SymID id;
  StackSym *pSVar1;
  
  id = SymTable::NewID(func->m_symTable);
  pSVar1 = New(id,type,0xffffffff,func);
  pSVar1->field_0x1a = pSVar1->field_0x1a | 0x10;
  *(ArgSlot *)&(pSVar1->super_Sym).field_0x16 = argSlotNum;
  pSVar1->m_argPosition = 0;
  return pSVar1;
}

Assistant:

StackSym *
StackSym::NewArgSlotSym(Js::ArgSlot argSlotNum, Func * func, IRType type /* = TyVar */)
{
    StackSym * stackSym = StackSym::New(type, func);
    stackSym->m_isArgSlotSym = true;
    stackSym->m_slotNum = argSlotNum;

#if defined(_M_X64)
    stackSym->m_argPosition = 0;
#endif

    return stackSym;
}